

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_4x4_sse2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  byte bVar2;
  code *pcVar3;
  code *pcVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  bool bVar8;
  undefined1 auVar9 [12];
  int8_t *piVar10;
  uint uVar11;
  uint uVar12;
  undefined7 in_register_00000009;
  long lVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  undefined1 auVar16 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i buf0 [4];
  __m128i buf1 [4];
  undefined8 auStack_c8 [2];
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined1 local_98 [12];
  undefined2 local_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined8 local_78 [4];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  piVar10 = av1_fwd_txfm_shift_ls[0];
  puVar15 = (undefined8 *)local_b8;
  uVar12 = (uint)CONCAT71(in_register_00000009,tx_type);
  bVar8 = false;
  if (uVar12 < 0x10) {
    if ((0x4110U >> (uVar12 & 0x1f) & 1) != 0) {
LAB_004ba5c5:
      lVar13 = 0x40;
      do {
        *(undefined8 *)((long)auStack_c8 + lVar13) = *(undefined8 *)input;
        *(undefined8 *)(local_b8 + lVar13 + -8) = 0;
        input = input + stride;
        lVar13 = lVar13 + -0x10;
      } while (lVar13 != 0);
      goto LAB_004ba5e3;
    }
    if ((0x80a0U >> (uVar12 & 0x1f) & 1) == 0) {
      if (uVar12 == 6) {
        bVar8 = true;
        goto LAB_004ba5c5;
      }
    }
    else {
      bVar8 = true;
    }
  }
  lVar13 = 0;
  do {
    *(undefined8 *)(local_b8 + lVar13) = *(undefined8 *)input;
    *(undefined8 *)(local_b8 + lVar13 + 8) = 0;
    lVar13 = lVar13 + 0x10;
    input = input + stride;
  } while (lVar13 != 0x40);
LAB_004ba5e3:
  pcVar3 = *(code **)((long)col_txfm4x4_arr + (ulong)(uVar12 * 8));
  bVar2 = *av1_fwd_txfm_shift_ls[0];
  uVar11 = (uint)(char)bVar2;
  if ((int)uVar11 < 0) {
    auVar24 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar24 = pshuflw(auVar24,auVar24,0);
    auVar24._4_4_ = auVar24._0_4_;
    auVar24._8_4_ = auVar24._0_4_;
    auVar24._12_4_ = auVar24._0_4_;
    lVar13 = 0;
    do {
      auVar28 = paddsw(*(undefined1 (*) [16])(local_b8 + lVar13),auVar24);
      auVar28 = psraw(auVar28,ZEXT416(-uVar11));
      *(undefined1 (*) [16])(local_b8 + lVar13) = auVar28;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  else if (bVar2 != 0) {
    lVar13 = 0;
    do {
      auVar24 = psllw(*(undefined1 (*) [16])(local_b8 + lVar13),ZEXT416(uVar11));
      *(undefined1 (*) [16])(local_b8 + lVar13) = auVar24;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  pcVar4 = *(code **)((long)row_txfm4x4_arr + (ulong)(uVar12 * 8));
  auStack_c8[1] = 0x4ba676;
  (*pcVar3)(local_b8,local_b8,0xd);
  bVar2 = piVar10[1];
  uVar12 = (uint)(char)bVar2;
  if ((int)uVar12 < 0) {
    auVar24 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar24 = pshuflw(auVar24,auVar24,0);
    auVar28._0_4_ = auVar24._0_4_;
    auVar28._4_4_ = auVar28._0_4_;
    auVar28._8_4_ = auVar28._0_4_;
    auVar28._12_4_ = auVar28._0_4_;
    lVar13 = 0;
    do {
      auVar24 = paddsw(*(undefined1 (*) [16])(local_b8 + lVar13),auVar28);
      auVar24 = psraw(auVar24,ZEXT416(-uVar12));
      *(undefined1 (*) [16])(local_b8 + lVar13) = auVar24;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  else if (bVar2 != 0) {
    lVar13 = 0;
    do {
      auVar24 = psllw(*(undefined1 (*) [16])(local_b8 + lVar13),ZEXT416(uVar12));
      *(undefined1 (*) [16])(local_b8 + lVar13) = auVar24;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  auVar19._12_2_ = local_b8._6_2_;
  auVar19._0_12_ = _local_b8;
  auVar19._14_2_ = uStack_a2;
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._0_10_ = local_b8._0_10_;
  auVar18._10_2_ = uStack_a4;
  auVar17._10_6_ = auVar18._10_6_;
  auVar17._0_8_ = local_b8;
  auVar17._8_2_ = local_b8._4_2_;
  auVar6._4_8_ = auVar17._8_8_;
  auVar6._2_2_ = uStack_a6;
  auVar6._0_2_ = local_b8._2_2_;
  auVar16._0_4_ = CONCAT22(local_a8,local_b8._0_2_);
  auVar16._4_12_ = auVar6;
  auVar27._12_2_ = local_98._6_2_;
  auVar27._0_12_ = local_98;
  auVar27._14_2_ = uStack_82;
  auVar26._12_4_ = auVar27._12_4_;
  auVar26._0_10_ = local_98._0_10_;
  auVar26._10_2_ = uStack_84;
  auVar25._10_6_ = auVar26._10_6_;
  auVar25._0_8_ = local_98._0_8_;
  auVar25._8_2_ = local_98._4_2_;
  auVar7._4_8_ = auVar25._8_8_;
  auVar7._2_2_ = uStack_86;
  auVar7._0_2_ = local_98._2_2_;
  auVar29._0_8_ = auVar16._0_8_;
  auVar29._8_4_ = auVar6._0_4_;
  auVar29._12_4_ = auVar7._0_4_;
  local_78[0] = CONCAT44(CONCAT22(local_88,local_98._0_2_),auVar16._0_4_);
  local_78[1] = auVar29._8_8_;
  local_78[2] = auVar29._8_8_;
  local_78[3] = 0;
  local_58._4_4_ = auVar25._8_4_;
  local_58._0_4_ = auVar17._8_4_;
  local_58._8_4_ = auVar18._12_4_;
  local_58._12_4_ = auVar26._12_4_;
  local_48 = local_58 >> 0x40;
  if (bVar8) {
    lVar13 = 0x40;
    puVar14 = local_78;
    do {
      uVar5 = puVar14[1];
      *(undefined8 *)((long)auStack_c8 + lVar13) = *puVar14;
      *(undefined8 *)(local_b8 + lVar13 + -8) = uVar5;
      puVar14 = puVar14 + 2;
      lVar13 = lVar13 + -0x10;
    } while (lVar13 != 0);
  }
  else {
    puVar15 = local_78;
  }
  auStack_c8[1] = 0x4ba75e;
  auVar20._0_8_ = (*pcVar4)(puVar15,puVar15,0xd);
  auVar20._8_8_ = extraout_XMM0_Qb;
  bVar2 = piVar10[2];
  if ((char)bVar2 < '\0') {
    auVar24 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar24 = pshuflw(auVar24,auVar24,0);
    auVar20._0_4_ = auVar24._0_4_;
    auVar20._4_4_ = auVar20._0_4_;
    auVar20._8_4_ = auVar20._0_4_;
    auVar20._12_4_ = auVar20._0_4_;
    lVar13 = 0;
    do {
      auVar24 = paddsw(*(undefined1 (*) [16])((long)puVar15 + lVar13),auVar20);
      auVar24 = psraw(auVar24,ZEXT416((uint)-(int)(char)bVar2));
      *(undefined1 (*) [16])((long)puVar15 + lVar13) = auVar24;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  else if (bVar2 != 0) {
    lVar13 = 0;
    auVar20 = ZEXT416((uint)(int)(char)bVar2);
    do {
      auVar24 = psllw(*(undefined1 (*) [16])((long)puVar15 + lVar13),auVar20);
      *(undefined1 (*) [16])((long)puVar15 + lVar13) = auVar24;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  lVar13 = 0;
  do {
    psVar1 = (short *)((long)puVar15 + lVar13);
    auVar23._0_12_ = auVar20._0_12_;
    auVar23._12_2_ = auVar20._6_2_;
    auVar23._14_2_ = psVar1[3];
    auVar22._12_4_ = auVar23._12_4_;
    auVar22._0_10_ = auVar20._0_10_;
    auVar22._10_2_ = psVar1[2];
    auVar21._10_6_ = auVar22._10_6_;
    auVar21._0_8_ = auVar20._0_8_;
    auVar21._8_2_ = auVar20._4_2_;
    auVar9._4_8_ = auVar21._8_8_;
    auVar9._2_2_ = psVar1[1];
    auVar9._0_2_ = auVar20._2_2_;
    auVar20._0_4_ = (int)*psVar1;
    auVar20._4_4_ = auVar9._0_4_ >> 0x10;
    auVar20._8_4_ = auVar21._8_4_ >> 0x10;
    auVar20._12_4_ = auVar22._12_4_ >> 0x10;
    *(undefined1 (*) [16])((long)output + lVar13) = auVar20;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x40);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_4x4_sse2(const int16_t *input, int32_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[4], buf1[4], *buf;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X4];
  const int txw_idx = get_txw_idx(TX_4X4);
  const int txh_idx = get_txh_idx(TX_4X4);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 4;
  const int height = 4;
  const transform_1d_sse2 col_txfm = col_txfm4x4_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm4x4_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_w4_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit_w4(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_4x4(buf0, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_buffer_16bit_to_32bit_w4(buf, output, height, width);
}